

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O0

void __thiscall libtorrent::add_torrent_alert::~add_torrent_alert(add_torrent_alert *this)

{
  add_torrent_alert *this_local;
  
  ~add_torrent_alert(this);
  operator_delete(this,0x390);
  return;
}

Assistant:

struct TORRENT_EXPORT add_torrent_alert final : torrent_alert
	{
		// internal
		TORRENT_UNEXPORT add_torrent_alert(aux::stack_allocator& alloc, torrent_handle const& h
			, add_torrent_params p, error_code const& ec);

		TORRENT_DEFINE_ALERT_PRIO(add_torrent_alert, 67, alert_priority::critical)

		static inline constexpr alert_category_t static_category = alert_category::status;
		std::string message() const override;

		// This contains copies of the most important fields from the original
		// add_torrent_params object, passed to add_torrent() or
		// async_add_torrent(). Specifically, these fields are copied:
		//
		// * version
		// * ti
		// * name
		// * save_path
		// * userdata
		// * tracker_id
		// * flags
		// * info_hash
		//
		// the info_hash field will be updated with the info-hash of the torrent
		// specified by ``ti``.
		add_torrent_params params;

		// set to the error, if one occurred while adding the torrent.
		error_code error;
	}